

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clauseChemObjName(SelectionCompiler *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  long *plVar4;
  SelectionCompiler *this_00;
  string name;
  Token token;
  _Arg __arg;
  code *local_88;
  _Storage local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  any local_30;
  undefined8 local_20;
  
  tokenNext((Token *)(local_58 + 0x20),this);
  if (local_58._32_4_ == 1) {
    ptVar3 = std::any::type(&local_30);
    __s1 = *(char **)(ptVar3 + 8);
    if (__s1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_002417e5:
      plVar4 = (long *)std::__any_caster<std::__cxx11::string>(&local_30);
      if (plVar4 == (long *)0x0) {
        std::__throw_bad_any_cast();
      }
      this_00 = (SelectionCompiler *)local_58;
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)this_00,*plVar4,plVar4[1] + *plVar4);
      bVar1 = isNameValid(this_00,(string *)local_58);
      if (bVar1) {
        local_88 = std::any::
                   _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::_S_manage;
        local_80._M_ptr = (void *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        local_78._0_8_ = (pointer)0x40b;
        local_68._M_allocated_capacity = 0;
        if (local_88 == (code *)0x0) {
          local_78._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        else {
          local_20 = (any *)(local_78 + 8);
          (*local_88)(2,&local_88);
        }
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                  (&this->ltokenPostfix,(value_type *)local_78);
        if ((_func_void__Op_any_ptr__Arg_ptr *)local_78._8_8_ !=
            (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*(code *)local_78._8_8_)(_Op_destroy,(any *)(local_78 + 8),(_Arg *)0x0);
          local_78._8_8_ = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        if (local_88 != (code *)0x0) {
          (*local_88)(3,&local_88,0);
          local_88 = (code *)0x0;
        }
        bVar1 = true;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"invalid name: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        bVar1 = compileError(this,(string *)local_78);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
      goto LAB_002417b8;
    }
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar2 == 0) goto LAB_002417e5;
    }
  }
  bVar1 = false;
LAB_002417b8:
  if (local_30._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_30._M_manager)(_Op_destroy,&local_30,(_Arg *)0x0);
  }
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseChemObjName() {
    Token token = tokenNext();
    if (token.tok == Token::identifier &&
        token.value.type() == typeid(std::string)) {
      std::string name = std::any_cast<std::string>(token.value);
      if (isNameValid(name)) {
        return addTokenToPostfix(Token(Token::name, name));
      } else {
        return compileError("invalid name: " + name);
      }
    }

    return false;
  }